

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_bzip2.c
# Opt level: O3

int archive_read_support_filter_bzip2(archive *_a)

{
  int iVar1;
  archive_read_filter_bidder *in_RAX;
  int iVar2;
  archive_read_filter_bidder *reader;
  archive_read_filter_bidder *local_18;
  
  local_18 = in_RAX;
  iVar1 = __archive_check_magic(_a,0xdeb0c5,1,"archive_read_support_filter_bzip2");
  iVar2 = -0x1e;
  if (iVar1 != -0x1e) {
    iVar1 = __archive_read_get_bidder((archive_read *)_a,&local_18);
    if (iVar1 == 0) {
      local_18->data = (void *)0x0;
      local_18->name = "bzip2";
      local_18->bid = bzip2_reader_bid;
      local_18->init = bzip2_reader_init;
      local_18->options = (_func_int_archive_read_filter_bidder_ptr_char_ptr_char_ptr *)0x0;
      local_18->free = bzip2_reader_free;
      archive_set_error(_a,-1,"Using external bzip2 program");
      iVar2 = -0x14;
    }
  }
  return iVar2;
}

Assistant:

int
archive_read_support_filter_bzip2(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct archive_read_filter_bidder *reader;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_read_support_filter_bzip2");

	if (__archive_read_get_bidder(a, &reader) != ARCHIVE_OK)
		return (ARCHIVE_FATAL);

	reader->data = NULL;
	reader->name = "bzip2";
	reader->bid = bzip2_reader_bid;
	reader->init = bzip2_reader_init;
	reader->options = NULL;
	reader->free = bzip2_reader_free;
#if defined(HAVE_BZLIB_H) && defined(BZ_CONFIG_ERROR)
	return (ARCHIVE_OK);
#else
	archive_set_error(_a, ARCHIVE_ERRNO_MISC,
	    "Using external bzip2 program");
	return (ARCHIVE_WARN);
#endif
}